

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::convert_non_uniform_expression
          (CompilerGLSL *this,string *expr,uint32_t ptr_id)

{
  ulong uVar1;
  char cVar2;
  SPIRVariable *pSVar3;
  SPIRType *pSVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  string local_a8 [32];
  spirv_cross local_88 [32];
  string local_68 [32];
  string local_48;
  
  if ((((*(this->backend).nonuniform_qualifier != '\0') &&
       (pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr_id),
       pSVar3 != (SPIRVariable *)0x0)) && (pSVar3->storage < (StorageBuffer|Input))) &&
     ((((0x1005U >> (pSVar3->storage & 0x1f) & 1) != 0 &&
       (pSVar4 = Compiler::get<spirv_cross::SPIRType>
                           (&this->super_Compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc),
       (pSVar4->array).super_VectorView<unsigned_int>.buffer_size != 0)) &&
      (uVar5 = ::std::__cxx11::string::find((char)expr,0x5b), uVar5 != 0xffffffffffffffff)))) {
    iVar6 = 1;
    for (lVar7 = 0; uVar1 = uVar5 + 1 + lVar7, uVar1 < expr->_M_string_length; lVar7 = lVar7 + 1) {
      cVar2 = (expr->_M_dataplus)._M_p[lVar7 + uVar5 + 1];
      if (cVar2 == ']') {
        iVar6 = iVar6 + -1;
        if (iVar6 == 0) {
          if (uVar1 < uVar5) {
            return;
          }
          ::std::__cxx11::string::substr((ulong)local_88,(ulong)expr);
          ::std::__cxx11::string::substr((ulong)local_a8,(ulong)expr);
          ::std::__cxx11::string::substr((ulong)local_68,(ulong)expr);
          join<std::__cxx11::string,char_const*&,char_const(&)[2],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                    (&local_48,local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &(this->backend).nonuniform_qualifier,(char **)0x39e911,(char (*) [2])local_a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
                     (char (*) [2])local_68,in_stack_ffffffffffffff50);
          ::std::__cxx11::string::operator=((string *)expr,(string *)&local_48);
          ::std::__cxx11::string::~string((string *)&local_48);
          ::std::__cxx11::string::~string(local_68);
          ::std::__cxx11::string::~string(local_a8);
          ::std::__cxx11::string::~string((string *)local_88);
          return;
        }
      }
      else {
        iVar6 = iVar6 + (uint)(cVar2 == '[');
      }
    }
    if (iVar6 != 0) {
      __assert_fail("bracket_count == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_glsl.cpp"
                    ,0x4767,
                    "void spirv_cross::CompilerGLSL::convert_non_uniform_expression(string &, uint32_t)"
                   );
    }
  }
  return;
}

Assistant:

void CompilerGLSL::convert_non_uniform_expression(string &expr, uint32_t ptr_id)
{
	if (*backend.nonuniform_qualifier == '\0')
		return;

	auto *var = maybe_get_backing_variable(ptr_id);
	if (!var)
		return;

	if (var->storage != StorageClassUniformConstant &&
	    var->storage != StorageClassStorageBuffer &&
	    var->storage != StorageClassUniform)
		return;

	auto &backing_type = get<SPIRType>(var->basetype);
	if (backing_type.array.empty())
		return;

	// If we get here, we know we're accessing an arrayed resource which
	// might require nonuniform qualifier.

	auto start_array_index = expr.find_first_of('[');

	if (start_array_index == string::npos)
		return;

	// We've opened a bracket, track expressions until we can close the bracket.
	// This must be our resource index.
	size_t end_array_index = string::npos;
	unsigned bracket_count = 1;
	for (size_t index = start_array_index + 1; index < expr.size(); index++)
	{
		if (expr[index] == ']')
		{
			if (--bracket_count == 0)
			{
				end_array_index = index;
				break;
			}
		}
		else if (expr[index] == '[')
			bracket_count++;
	}

	assert(bracket_count == 0);

	// Doesn't really make sense to declare a non-arrayed image with nonuniformEXT, but there's
	// nothing we can do here to express that.
	if (start_array_index == string::npos || end_array_index == string::npos || end_array_index < start_array_index)
		return;

	start_array_index++;

	expr = join(expr.substr(0, start_array_index), backend.nonuniform_qualifier, "(",
	            expr.substr(start_array_index, end_array_index - start_array_index), ")",
	            expr.substr(end_array_index, string::npos));
}